

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall cmTarget::SetProperty(cmTarget *this,string *prop,char *value)

{
  cmMakefile *pcVar1;
  bool bVar2;
  TargetType TVar3;
  ostream *poVar4;
  cmTargetInternals *pcVar5;
  TargetPropertyEntry *pTVar6;
  auto_ptr<cmCompiledGeneratorExpression> local_938;
  TargetPropertyEntry *local_930;
  cmGeneratorExpression local_928;
  cmCompiledGeneratorExpression *local_920;
  auto_ptr<cmCompiledGeneratorExpression> local_918;
  auto_ptr<cmCompiledGeneratorExpression> cge_4;
  cmGeneratorExpression ge_4;
  cmListFileBacktrace lfbt_5;
  ostringstream local_8b8 [8];
  ostringstream e_3;
  allocator local_739;
  string local_738;
  undefined1 local_718 [8];
  cmValueWithOrigin entry;
  cmListFileBacktrace lfbt_4;
  ostringstream local_678 [8];
  ostringstream e_2;
  auto_ptr<cmCompiledGeneratorExpression> local_4f8;
  TargetPropertyEntry *local_4f0;
  cmGeneratorExpression local_4e8;
  cmCompiledGeneratorExpression *local_4e0;
  auto_ptr<cmCompiledGeneratorExpression> local_4d8;
  auto_ptr<cmCompiledGeneratorExpression> cge_3;
  cmGeneratorExpression ge_3;
  cmListFileBacktrace lfbt_3;
  auto_ptr<cmCompiledGeneratorExpression> local_490;
  TargetPropertyEntry *local_488;
  cmGeneratorExpression local_480;
  cmCompiledGeneratorExpression *local_478;
  auto_ptr<cmCompiledGeneratorExpression> local_470;
  auto_ptr<cmCompiledGeneratorExpression> cge_2;
  cmGeneratorExpression ge_2;
  cmListFileBacktrace lfbt_2;
  auto_ptr<cmCompiledGeneratorExpression> local_428;
  TargetPropertyEntry *local_420;
  cmGeneratorExpression local_418;
  cmCompiledGeneratorExpression *local_410;
  auto_ptr<cmCompiledGeneratorExpression> local_408;
  auto_ptr<cmCompiledGeneratorExpression> cge_1;
  cmGeneratorExpression ge_1;
  cmListFileBacktrace lfbt_1;
  auto_ptr<cmCompiledGeneratorExpression> local_3c0;
  TargetPropertyEntry *local_3b8;
  cmGeneratorExpression local_3b0;
  cmCompiledGeneratorExpression *local_3a8;
  auto_ptr<cmCompiledGeneratorExpression> local_3a0;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  cmGeneratorExpression ge;
  cmListFileBacktrace lfbt;
  ostringstream local_340 [8];
  ostringstream e_1;
  string local_1c8;
  ostringstream local_198 [8];
  ostringstream e;
  char *value_local;
  string *prop_local;
  cmTarget *this_local;
  
  TVar3 = GetType(this);
  if ((TVar3 != INTERFACE_LIBRARY) || (bVar2 = whiteListedInterfaceProperty(prop), bVar2)) {
    bVar2 = std::operator==(prop,"NAME");
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream(local_340);
      std::operator<<((ostream *)local_340,"NAME property is read-only\n");
      pcVar1 = this->Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&lfbt.Snapshot.Position.Position);
      std::__cxx11::string::~string((string *)&lfbt.Snapshot.Position.Position);
      std::__cxx11::ostringstream::~ostringstream(local_340);
    }
    else {
      bVar2 = std::operator==(prop,"INCLUDE_DIRECTORIES");
      if (bVar2) {
        cmMakefile::GetBacktrace((cmListFileBacktrace *)&ge,this->Makefile);
        cmGeneratorExpression::cmGeneratorExpression
                  ((cmGeneratorExpression *)&cge,(cmListFileBacktrace *)&ge);
        pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
        deleteAndClear(&pcVar5->IncludeDirectoriesEntries);
        cmGeneratorExpression::Parse(&local_3b0,(char *)&cge);
        local_3a8 = (cmCompiledGeneratorExpression *)
                    cmsys::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_3b0);
        cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
                  (&local_3a0,(auto_ptr_ref<cmCompiledGeneratorExpression>)local_3a8);
        cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                  ((auto_ptr<cmCompiledGeneratorExpression> *)&local_3b0);
        pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
        pTVar6 = (TargetPropertyEntry *)operator_new(0x10);
        cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr(&local_3c0,&local_3a0);
        cmTargetInternals::TargetPropertyEntry::TargetPropertyEntry
                  (pTVar6,&local_3c0,&cmTargetInternals::TargetPropertyEntry::NoLinkImplItem);
        local_3b8 = pTVar6;
        std::
        vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
        ::push_back(&pcVar5->IncludeDirectoriesEntries,&local_3b8);
        cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_3c0);
        cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_3a0);
        cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)&cge);
        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&ge);
      }
      else {
        bVar2 = std::operator==(prop,"COMPILE_OPTIONS");
        if (bVar2) {
          cmMakefile::GetBacktrace((cmListFileBacktrace *)&ge_1,this->Makefile);
          cmGeneratorExpression::cmGeneratorExpression
                    ((cmGeneratorExpression *)&cge_1,(cmListFileBacktrace *)&ge_1);
          pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
          deleteAndClear(&pcVar5->CompileOptionsEntries);
          cmGeneratorExpression::Parse(&local_418,(char *)&cge_1);
          local_410 = (cmCompiledGeneratorExpression *)
                      cmsys::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_418);
          cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
                    (&local_408,(auto_ptr_ref<cmCompiledGeneratorExpression>)local_410);
          cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                    ((auto_ptr<cmCompiledGeneratorExpression> *)&local_418);
          pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
          pTVar6 = (TargetPropertyEntry *)operator_new(0x10);
          cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr(&local_428,&local_408);
          cmTargetInternals::TargetPropertyEntry::TargetPropertyEntry
                    (pTVar6,&local_428,&cmTargetInternals::TargetPropertyEntry::NoLinkImplItem);
          local_420 = pTVar6;
          std::
          vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
          ::push_back(&pcVar5->CompileOptionsEntries,&local_420);
          cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_428);
          cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_408);
          cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)&cge_1);
          cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&ge_1);
        }
        else {
          bVar2 = std::operator==(prop,"COMPILE_FEATURES");
          if (bVar2) {
            cmMakefile::GetBacktrace((cmListFileBacktrace *)&ge_2,this->Makefile);
            cmGeneratorExpression::cmGeneratorExpression
                      ((cmGeneratorExpression *)&cge_2,(cmListFileBacktrace *)&ge_2);
            pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
            deleteAndClear(&pcVar5->CompileFeaturesEntries);
            cmGeneratorExpression::Parse(&local_480,(char *)&cge_2);
            local_478 = (cmCompiledGeneratorExpression *)
                        cmsys::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_480);
            cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
                      (&local_470,(auto_ptr_ref<cmCompiledGeneratorExpression>)local_478);
            cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                      ((auto_ptr<cmCompiledGeneratorExpression> *)&local_480);
            pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
            pTVar6 = (TargetPropertyEntry *)operator_new(0x10);
            cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr(&local_490,&local_470);
            cmTargetInternals::TargetPropertyEntry::TargetPropertyEntry
                      (pTVar6,&local_490,&cmTargetInternals::TargetPropertyEntry::NoLinkImplItem);
            local_488 = pTVar6;
            std::
            vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
            ::push_back(&pcVar5->CompileFeaturesEntries,&local_488);
            cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_490);
            cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_470);
            cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)&cge_2);
            cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&ge_2);
          }
          else {
            bVar2 = std::operator==(prop,"COMPILE_DEFINITIONS");
            if (bVar2) {
              cmMakefile::GetBacktrace((cmListFileBacktrace *)&ge_3,this->Makefile);
              cmGeneratorExpression::cmGeneratorExpression
                        ((cmGeneratorExpression *)&cge_3,(cmListFileBacktrace *)&ge_3);
              pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
              deleteAndClear(&pcVar5->CompileDefinitionsEntries);
              cmGeneratorExpression::Parse(&local_4e8,(char *)&cge_3);
              local_4e0 = (cmCompiledGeneratorExpression *)
                          cmsys::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_4e8);
              cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
                        (&local_4d8,(auto_ptr_ref<cmCompiledGeneratorExpression>)local_4e0);
              cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                        ((auto_ptr<cmCompiledGeneratorExpression> *)&local_4e8);
              pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
              pTVar6 = (TargetPropertyEntry *)operator_new(0x10);
              cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr(&local_4f8,&local_4d8);
              cmTargetInternals::TargetPropertyEntry::TargetPropertyEntry
                        (pTVar6,&local_4f8,&cmTargetInternals::TargetPropertyEntry::NoLinkImplItem);
              local_4f0 = pTVar6;
              std::
              vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
              ::push_back(&pcVar5->CompileDefinitionsEntries,&local_4f0);
              cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_4f8);
              cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_4d8);
              cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)&cge_3);
              cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&ge_3);
            }
            else {
              bVar2 = std::operator==(prop,"EXPORT_NAME");
              if ((bVar2) && (bVar2 = IsImported(this), bVar2)) {
                std::__cxx11::ostringstream::ostringstream(local_678);
                poVar4 = std::operator<<((ostream *)local_678,
                                         "EXPORT_NAME property can\'t be set on imported targets (\""
                                        );
                poVar4 = std::operator<<(poVar4,(string *)&this->Name);
                std::operator<<(poVar4,"\")\n");
                pcVar1 = this->Makefile;
                std::__cxx11::ostringstream::str();
                cmMakefile::IssueMessage
                          (pcVar1,FATAL_ERROR,(string *)&lfbt_4.Snapshot.Position.Position);
                std::__cxx11::string::~string((string *)&lfbt_4.Snapshot.Position.Position);
                std::__cxx11::ostringstream::~ostringstream(local_678);
              }
              else {
                bVar2 = std::operator==(prop,"LINK_LIBRARIES");
                if (bVar2) {
                  pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
                  std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::clear
                            (&pcVar5->LinkImplementationPropertyEntries);
                  cmMakefile::GetBacktrace
                            ((cmListFileBacktrace *)&entry.Backtrace.Snapshot.Position.Position,
                             this->Makefile);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string((string *)&local_738,value,&local_739);
                  cmValueWithOrigin::cmValueWithOrigin
                            ((cmValueWithOrigin *)local_718,&local_738,
                             (cmListFileBacktrace *)&entry.Backtrace.Snapshot.Position.Position);
                  std::__cxx11::string::~string((string *)&local_738);
                  std::allocator<char>::~allocator((allocator<char> *)&local_739);
                  pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
                  std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::push_back
                            (&pcVar5->LinkImplementationPropertyEntries,(value_type *)local_718);
                  cmValueWithOrigin::~cmValueWithOrigin((cmValueWithOrigin *)local_718);
                  cmListFileBacktrace::~cmListFileBacktrace
                            ((cmListFileBacktrace *)&entry.Backtrace.Snapshot.Position.Position);
                }
                else {
                  bVar2 = std::operator==(prop,"SOURCES");
                  if (bVar2) {
                    bVar2 = IsImported(this);
                    if (bVar2) {
                      std::__cxx11::ostringstream::ostringstream(local_8b8);
                      poVar4 = std::operator<<((ostream *)local_8b8,
                                               "SOURCES property can\'t be set on imported targets (\""
                                              );
                      poVar4 = std::operator<<(poVar4,(string *)&this->Name);
                      std::operator<<(poVar4,"\")\n");
                      pcVar1 = this->Makefile;
                      std::__cxx11::ostringstream::str();
                      cmMakefile::IssueMessage
                                (pcVar1,FATAL_ERROR,(string *)&lfbt_5.Snapshot.Position.Position);
                      std::__cxx11::string::~string((string *)&lfbt_5.Snapshot.Position.Position);
                      std::__cxx11::ostringstream::~ostringstream(local_8b8);
                    }
                    else {
                      pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
                      std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                      ::clear(&pcVar5->SourceFilesMap);
                      cmMakefile::GetBacktrace((cmListFileBacktrace *)&ge_4,this->Makefile);
                      cmGeneratorExpression::cmGeneratorExpression
                                ((cmGeneratorExpression *)&cge_4,(cmListFileBacktrace *)&ge_4);
                      pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
                      std::
                      vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                      ::clear(&pcVar5->SourceEntries);
                      cmGeneratorExpression::Parse(&local_928,(char *)&cge_4);
                      local_920 = (cmCompiledGeneratorExpression *)
                                  cmsys::auto_ptr::operator_cast_to_auto_ptr_ref
                                            ((auto_ptr *)&local_928);
                      cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
                                (&local_918,(auto_ptr_ref<cmCompiledGeneratorExpression>)local_920);
                      cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                                ((auto_ptr<cmCompiledGeneratorExpression> *)&local_928);
                      pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
                      pTVar6 = (TargetPropertyEntry *)operator_new(0x10);
                      cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
                                (&local_938,&local_918);
                      cmTargetInternals::TargetPropertyEntry::TargetPropertyEntry
                                (pTVar6,&local_938,
                                 &cmTargetInternals::TargetPropertyEntry::NoLinkImplItem);
                      local_930 = pTVar6;
                      std::
                      vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                      ::push_back(&pcVar5->SourceEntries,&local_930);
                      cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_938);
                      cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_918);
                      cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)&cge_4)
                      ;
                      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&ge_4);
                    }
                  }
                  else {
                    cmPropertyMap::SetProperty(&this->Properties,prop,value);
                    MaybeInvalidatePropertyCache(this,prop);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar4 = std::operator<<((ostream *)local_198,
                             "INTERFACE_LIBRARY targets may only have whitelisted properties.  The property \""
                            );
    poVar4 = std::operator<<(poVar4,(string *)prop);
    std::operator<<(poVar4,"\" is not allowed.");
    pcVar1 = this->Makefile;
    std::__cxx11::ostringstream::str();
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::ostringstream::~ostringstream(local_198);
  }
  return;
}

Assistant:

void cmTarget::SetProperty(const std::string& prop, const char* value)
{
  if (this->GetType() == INTERFACE_LIBRARY
      && !whiteListedInterfaceProperty(prop))
    {
    std::ostringstream e;
    e << "INTERFACE_LIBRARY targets may only have whitelisted properties.  "
         "The property \"" << prop << "\" is not allowed.";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
    }
  else if (prop == "NAME")
    {
    std::ostringstream e;
    e << "NAME property is read-only\n";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
    }
  else if(prop == "INCLUDE_DIRECTORIES")
    {
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    cmGeneratorExpression ge(&lfbt);
    deleteAndClear(this->Internal->IncludeDirectoriesEntries);
    cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(value);
    this->Internal->IncludeDirectoriesEntries.push_back(
                          new cmTargetInternals::TargetPropertyEntry(cge));
    }
  else if(prop == "COMPILE_OPTIONS")
    {
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    cmGeneratorExpression ge(&lfbt);
    deleteAndClear(this->Internal->CompileOptionsEntries);
    cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(value);
    this->Internal->CompileOptionsEntries.push_back(
                          new cmTargetInternals::TargetPropertyEntry(cge));
    }
  else if(prop == "COMPILE_FEATURES")
    {
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    cmGeneratorExpression ge(&lfbt);
    deleteAndClear(this->Internal->CompileFeaturesEntries);
    cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(value);
    this->Internal->CompileFeaturesEntries.push_back(
                          new cmTargetInternals::TargetPropertyEntry(cge));
    }
  else if(prop == "COMPILE_DEFINITIONS")
    {
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    cmGeneratorExpression ge(&lfbt);
    deleteAndClear(this->Internal->CompileDefinitionsEntries);
    cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(value);
    this->Internal->CompileDefinitionsEntries.push_back(
                          new cmTargetInternals::TargetPropertyEntry(cge));
    }
  else if(prop == "EXPORT_NAME" && this->IsImported())
    {
    std::ostringstream e;
    e << "EXPORT_NAME property can't be set on imported targets (\""
          << this->Name << "\")\n";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    }
  else if (prop == "LINK_LIBRARIES")
    {
    this->Internal->LinkImplementationPropertyEntries.clear();
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    cmValueWithOrigin entry(value, lfbt);
    this->Internal->LinkImplementationPropertyEntries.push_back(entry);
    }
  else if (prop == "SOURCES")
    {
    if(this->IsImported())
      {
      std::ostringstream e;
      e << "SOURCES property can't be set on imported targets (\""
            << this->Name << "\")\n";
      this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
      return;
      }
    this->Internal->SourceFilesMap.clear();
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    cmGeneratorExpression ge(&lfbt);
    this->Internal->SourceEntries.clear();
    cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(value);
    this->Internal->SourceEntries.push_back(
                          new cmTargetInternals::TargetPropertyEntry(cge));
    }
  else
    {
    this->Properties.SetProperty(prop, value);
    this->MaybeInvalidatePropertyCache(prop);
    }
}